

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::allocCallbackFailTest<vkt::api::(anonymous_namespace)::ImageView>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  string *psVar1;
  PlatformInterface *pPVar2;
  char *pcVar3;
  Deleter<vk::VkInstance_s_*> **ppDVar4;
  VkComponentMapping VVar5;
  bool bVar6;
  deUint32 dVar7;
  int iVar8;
  VkAllocationCallbacks *pVVar9;
  DeviceInterface *pDVar10;
  VkDevice pVVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  deUint32 dVar13;
  uint numPassingAllocs;
  ulong uVar14;
  uint uVar15;
  Resources res;
  AllocationCallbackRecorder recorder;
  AllocationCallbackRecorder resCallbacks;
  DeterministicFailAllocator objAllocator;
  EnvClone resEnv;
  Environment local_a80;
  Resources local_a48;
  VkImageViewCreateInfo local_9f8;
  undefined1 local_9a8 [8];
  Deleter<vk::Handle<(vk::HandleType)13>_> aDStack_9a0 [4];
  ios_base local_930 [264];
  Move<vk::Handle<(vk::HandleType)13>_> local_828;
  AllocationCallbackRecorder local_800;
  AllocationCallbackRecorder local_7a0;
  DeterministicFailAllocator local_740;
  EnvClone local_6f0;
  
  pVVar9 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&local_7a0,pVVar9,0x80);
  pPVar2 = context->m_platformInterface;
  pDVar10 = Context::getDeviceInterface(context);
  pVVar11 = Context::getDevice(context);
  local_a80.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_a80.programBinaries = context->m_progCollection;
  local_a80.allocationCallbacks =
       &local_7a0.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  local_a80.maxResourceConsumers = 1;
  local_a80.vkp = pPVar2;
  local_a80.vkd = pDVar10;
  local_a80.device = pVVar11;
  dVar7 = tcu::CommandLine::getTestIterationCount(context->m_testCtx->m_cmdLine);
  dVar13 = 0x400;
  if (dVar7 != 0) {
    dVar13 = dVar7;
  }
  iVar8 = tcu::CommandLine::getVKDeviceId(context->m_testCtx->m_cmdLine);
  local_9a8 = (undefined1  [8])((ulong)(iVar8 - 1U) | 0x300000000);
  EnvClone::EnvClone(&local_6f0,&local_a80,(Parameters *)local_9a8,iVar8 - 1U);
  ImageView::Resources::Resources(&local_a48,&local_6f0.env,&params);
  psVar1 = &__return_storage_ptr__->m_description;
  paVar12 = &(__return_storage_ptr__->m_description).field_2;
  uVar15 = dVar13 + (dVar13 == 0);
  uVar14 = 0;
  while( true ) {
    pVVar9 = ::vk::getSystemAllocator();
    numPassingAllocs = (uint)uVar14;
    ::vk::DeterministicFailAllocator::DeterministicFailAllocator
              (&local_740,pVVar9,MODE_COUNT_AND_FAIL,numPassingAllocs);
    ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
              (&local_800,&local_740.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks,
               0x80);
    pVVar11 = local_6f0.env.device;
    pDVar10 = local_6f0.env.vkd;
    local_9a8 = (undefined1  [8])context->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)aDStack_9a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aDStack_9a0,"Trying to create object with ",0x1d);
    std::ostream::_M_insert<unsigned_long>((ulong)aDStack_9a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)aDStack_9a0," allocation",0xb);
    pcVar3 = ",\n\t\t";
    if (uVar14 != 1) {
      pcVar3 = "%s<%s";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aDStack_9a0,pcVar3 + 4,(ulong)(uVar14 != 1));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)aDStack_9a0," passing",8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_9a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)aDStack_9a0);
    std::ios_base::~ios_base(local_930);
    VVar5 = params.components;
    local_9f8.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
    local_9f8.pNext = (void *)0x0;
    local_9f8.flags = 0;
    local_9f8.image.m_internal =
         local_a48.image.object.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
         m_internal;
    local_9f8.viewType = params.viewType;
    local_9f8.format = params.format;
    local_9f8.components.r = params.components.r;
    local_9f8.components.g = params.components.g;
    params.components._8_8_ = VVar5._8_8_;
    local_9f8.components.b = params.components.b;
    local_9f8.components.a = params.components.a;
    local_9f8.subresourceRange.layerCount = params.subresourceRange.layerCount;
    local_9f8.subresourceRange.aspectMask = params.subresourceRange.aspectMask;
    local_9f8.subresourceRange.baseMipLevel = params.subresourceRange.baseMipLevel;
    local_9f8.subresourceRange.levelCount = params.subresourceRange.levelCount;
    local_9f8.subresourceRange.baseArrayLayer = params.subresourceRange.baseArrayLayer;
    params.components = VVar5;
    ::vk::createImageView
              (&local_828,pDVar10,pVVar11,&local_9f8,
               &local_800.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks);
    local_9a8 = (undefined1  [8])
                local_828.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
    aDStack_9a0[0].m_deviceIface =
         local_828.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
    aDStack_9a0[0].m_device =
         local_828.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
    aDStack_9a0[0].m_allocator =
         local_828.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
    if (local_828.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                (aDStack_9a0,
                 (VkImageView)
                 local_828.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
    }
    bVar6 = ::vk::validateAndLog(context->m_testCtx->m_log,&local_800,0);
    if (bVar6) {
      local_9a8 = (undefined1  [8])context->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)aDStack_9a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aDStack_9a0,"Object construction succeeded! ",0x1f);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_9a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)aDStack_9a0);
      std::ios_base::~ios_base(local_930);
      iVar8 = 2;
    }
    else {
      local_9a8 = (undefined1  [8])&aDStack_9a0[0].m_device;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_9a8,"Invalid allocation callback","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar12;
      std::__cxx11::string::_M_construct<char*>
                ((string *)psVar1,local_9a8,
                 (long)&(aDStack_9a0[0].m_deviceIface)->_vptr_DeviceInterface + (long)local_9a8);
      if (local_9a8 != (undefined1  [8])&aDStack_9a0[0].m_device) {
        operator_delete((void *)local_9a8,(ulong)(aDStack_9a0[0].m_device + 1));
      }
      iVar8 = 1;
    }
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_800);
    ::vk::ChainedAllocator::~ChainedAllocator(&local_740.super_ChainedAllocator);
    if (iVar8 != 0) break;
    uVar14 = uVar14 + 1;
    if (uVar15 == uVar14) {
      bVar6 = true;
      numPassingAllocs = uVar15;
LAB_003fcbf2:
      if (local_a48.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
          m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
                  (&local_a48.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.
                    deleter,(VkDeviceMemory)
                            local_a48.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.
                            m_data.object.m_internal);
      }
      local_a48.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device
           = (VkDevice)0x0;
      local_a48.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)0x0;
      local_a48.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal
           = 0;
      local_a48.memory.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)0x0;
      if (local_a48.image.object.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
          m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                  (&local_a48.image.object.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                    deleter,(VkImage)local_a48.image.object.
                                     super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                                     m_internal);
      }
      local_a48.image.object.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_a48.image.object.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)0x0;
      local_a48.image.object.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
           = 0;
      local_a48.image.object.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)0x0;
      ::vk::DeviceDriver::~DeviceDriver(&local_6f0.vkd);
      if (local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.object != (VkDevice)0x0) {
        (*local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice)
                  (local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                   local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
      }
      local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.object = (VkDevice_s *)0x0;
      local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice =
           (DestroyDeviceFunc)0x0;
      local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      ::vk::InstanceDriver::~InstanceDriver(&local_6f0.deviceRes.vki);
      if (local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object !=
          (VkInstance)0x0) {
        (*local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
          m_destroyInstance)
                  (local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                   object,local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.
                          m_data.deleter.m_allocator);
      }
      local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object =
           (VkInstance_s *)0x0;
      local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
      m_destroyInstance = (DestroyInstanceFunc)0x0;
      local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)0x0;
      if (bVar6) {
        bVar6 = ::vk::validateAndLog(context->m_testCtx->m_log,&local_7a0,0);
        ppDVar4 = (Deleter<vk::VkInstance_s_*> **)
                  &local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                   deleter;
        local_6f0.deviceRes.instance._0_8_ = ppDVar4;
        if (bVar6) {
          if (numPassingAllocs == 0) {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_6f0,"Allocation callbacks not called","");
            __return_storage_ptr__->m_code = QP_TEST_RESULT_QUALITY_WARNING;
            (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar12;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)psVar1,local_6f0.deviceRes.instance._0_8_,
                       local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                       object + local_6f0.deviceRes.instance._0_8_);
          }
          else if (numPassingAllocs == dVar13) {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_6f0,"Max iter count reached; OOM testing incomplete","");
            __return_storage_ptr__->m_code = QP_TEST_RESULT_COMPATIBILITY_WARNING;
            (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar12;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)psVar1,local_6f0.deviceRes.instance._0_8_,
                       local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                       object + local_6f0.deviceRes.instance._0_8_);
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f0,"Ok","");
            __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
            (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar12;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)psVar1,local_6f0.deviceRes.instance._0_8_,
                       local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                       object + local_6f0.deviceRes.instance._0_8_);
          }
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_6f0,"Invalid allocation callback","");
          __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar12;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)psVar1,local_6f0.deviceRes.instance._0_8_,
                     local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                     object + local_6f0.deviceRes.instance._0_8_);
        }
        if ((Deleter<vk::VkInstance_s_*> **)local_6f0.deviceRes.instance._0_8_ != ppDVar4) {
          operator_delete((void *)local_6f0.deviceRes.instance._0_8_,
                          (ulong)(local_6f0.deviceRes.instance.object.
                                  super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance
                                 + 1));
        }
      }
      ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_7a0);
      return __return_storage_ptr__;
    }
  }
  bVar6 = iVar8 == 2;
  goto LAB_003fcbf2;
}

Assistant:

tcu::TestStatus allocCallbackFailTest (Context& context, typename Object::Parameters params)
{
	AllocationCallbackRecorder			resCallbacks		(getSystemAllocator(), 128);
	const Environment					rootEnv				(context.getPlatformInterface(),
															 context.getDeviceInterface(),
															 context.getDevice(),
															 context.getUniversalQueueFamilyIndex(),
															 context.getBinaryCollection(),
															 resCallbacks.getCallbacks(),
															 1u);
	deUint32							numPassingAllocs	= 0;
	const deUint32						cmdLineIterCount	= (deUint32)context.getTestContext().getCommandLine().getTestIterationCount();
	const deUint32						maxTries			= cmdLineIterCount != 0 ? cmdLineIterCount : getOomIterLimit<Object>();

	{
		const EnvClone						resEnv	(rootEnv, getDefaulDeviceParameters(context), 1u);
		const typename Object::Resources	res		(resEnv.env, params);

		// Iterate over test until object allocation succeeds
		for (; numPassingAllocs < maxTries; ++numPassingAllocs)
		{
			DeterministicFailAllocator			objAllocator(getSystemAllocator(),
															 DeterministicFailAllocator::MODE_COUNT_AND_FAIL,
															 numPassingAllocs);
			AllocationCallbackRecorder			recorder	(objAllocator.getCallbacks(), 128);
			const Environment					objEnv		(resEnv.env.vkp,
															 resEnv.env.vkd,
															 resEnv.env.device,
															 resEnv.env.queueFamilyIndex,
															 resEnv.env.programBinaries,
															 recorder.getCallbacks(),
															 resEnv.env.maxResourceConsumers);
			bool								createOk	= false;

			context.getTestContext().getLog()
				<< TestLog::Message
				<< "Trying to create object with " << numPassingAllocs << " allocation" << (numPassingAllocs != 1 ? "s" : "") << " passing"
				<< TestLog::EndMessage;

			try
			{
				Unique<typename Object::Type>	obj	(Object::create(objEnv, res, params));
				createOk = true;
			}
			catch (const vk::OutOfMemoryError& e)
			{
				if (e.getError() != VK_ERROR_OUT_OF_HOST_MEMORY)
				{
					context.getTestContext().getLog() << e;
					return tcu::TestStatus::fail("Got invalid error code");
				}
			}

			if (!validateAndLog(context.getTestContext().getLog(), recorder, 0u))
				return tcu::TestStatus::fail("Invalid allocation callback");

			if (createOk)
			{
				context.getTestContext().getLog()
					<< TestLog::Message << "Object construction succeeded! " << TestLog::EndMessage;
				break;
			}
		}
	}

	if (!validateAndLog(context.getTestContext().getLog(), resCallbacks, 0u))
		return tcu::TestStatus::fail("Invalid allocation callback");

	if (numPassingAllocs == 0)
		return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Allocation callbacks not called");
	else if (numPassingAllocs == maxTries)
		return tcu::TestStatus(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Max iter count reached; OOM testing incomplete");
	else
		return tcu::TestStatus::pass("Ok");
}